

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::SetMaximumPacketSize(RTPUDPv4Transmitter *this,size_t s)

{
  int iVar1;
  
  iVar1 = -0x5a;
  if (((this->init == true) && (iVar1 = -0x59, this->created == true)) &&
     (iVar1 = -0x5d, s < 0x10000)) {
    this->maxpacksize = s;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPUDPv4Transmitter::SetMaximumPacketSize(size_t s)	
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (s > RTPUDPV4TRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_SPECIFIEDSIZETOOBIG;
	}
	maxpacksize = s;
	MAINMUTEX_UNLOCK
	return 0;
}